

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int ptls_openssl_encrypt_ticket_evp
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_EVP_MAC_CTX_ptr_int *cb)

{
  uint8_t *puVar1;
  size_t sVar2;
  ptls_buffer_t *ppVar3;
  int iVar4;
  int iVar5;
  EVP_CIPHER_CTX *ctx;
  long lVar6;
  EVP_MAC_CTX *pEVar7;
  long lVar8;
  undefined8 uVar9;
  uchar *puVar10;
  int clen;
  long local_50;
  ptls_buffer_t *local_48;
  uint8_t *local_40;
  size_t hlen;
  
  ctx = EVP_CIPHER_CTX_new();
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    iVar4 = 0x201;
  }
  else {
    pEVar7 = (EVP_MAC_CTX *)0x0;
    local_48 = buf;
    local_40 = src.base;
    lVar6 = EVP_MAC_fetch(0,"HMAC",0);
    iVar4 = 0x201;
    if (lVar6 != 0) {
      pEVar7 = (EVP_MAC_CTX *)EVP_MAC_CTX_new(lVar6);
      ppVar3 = local_48;
      if (pEVar7 == (EVP_MAC_CTX *)0x0) {
        pEVar7 = (EVP_MAC_CTX *)0x0;
      }
      else {
        local_50 = lVar6;
        iVar4 = ptls_buffer_reserve(local_48,src.len + 0x80);
        lVar6 = local_50;
        if (iVar4 == 0) {
          puVar1 = ppVar3->base;
          sVar2 = ppVar3->off;
          puVar10 = puVar1 + sVar2;
          iVar5 = (*cb)(puVar10,puVar1 + sVar2 + 0x10,(EVP_CIPHER_CTX *)ctx,pEVar7,1);
          iVar4 = 0x203;
          lVar6 = local_50;
          if (iVar5 != 0) {
            puVar10 = puVar10 + 0x20;
            iVar5 = EVP_EncryptUpdate(ctx,puVar10,&clen,local_40,(int)src.len);
            lVar6 = local_50;
            if (iVar5 != 0) {
              lVar8 = (long)clen;
              iVar5 = EVP_EncryptFinal_ex(ctx,puVar10 + lVar8,&clen);
              if (iVar5 != 0) {
                puVar10 = puVar10 + lVar8 + clen;
                iVar5 = EVP_MAC_update(pEVar7,local_48->base + local_48->off,
                                       (long)puVar10 - (long)(local_48->base + local_48->off));
                if (iVar5 != 0) {
                  uVar9 = EVP_MAC_CTX_get_mac_size(pEVar7);
                  iVar5 = EVP_MAC_final(pEVar7,puVar10,&hlen,uVar9);
                  if (iVar5 != 0) {
                    if (local_48->base + local_48->capacity < puVar10 + hlen) {
                      __assert_fail("dst <= buf->base + buf->capacity",
                                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c"
                                    ,0x81e,
                                    "int ptls_openssl_encrypt_ticket_evp(ptls_buffer_t *, ptls_iovec_t, int (*)(unsigned char *, unsigned char *, EVP_CIPHER_CTX *, EVP_MAC_CTX *, int))"
                                   );
                    }
                    local_48->off = (long)(puVar10 + hlen) - (long)local_48->base;
                    iVar4 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    EVP_CIPHER_CTX_free(ctx);
    if (pEVar7 != (EVP_MAC_CTX *)0x0) {
      EVP_MAC_CTX_free(pEVar7);
    }
    if (lVar6 != 0) {
      EVP_MAC_free(lVar6);
    }
  }
  return iVar4;
}

Assistant:

int ptls_openssl_encrypt_ticket_evp(ptls_buffer_t *buf, ptls_iovec_t src,
                                    int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, EVP_MAC_CTX *hctx,
                                              int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    EVP_MAC *mac = NULL;
    EVP_MAC_CTX *hctx = NULL;
    size_t hlen;
    uint8_t *dst;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((mac = EVP_MAC_fetch(NULL, "HMAC", NULL)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = EVP_MAC_CTX_new(mac)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    if ((ret = ptls_buffer_reserve(buf, TICKET_LABEL_SIZE + TICKET_IV_SIZE + src.len + EVP_MAX_BLOCK_LENGTH + EVP_MAX_MD_SIZE)) !=
        0)
        goto Exit;
    dst = buf->base + buf->off;

    /* fill label and iv, as well as obtaining the keys */
    if (!(*cb)(dst, dst + TICKET_LABEL_SIZE, cctx, hctx, 1)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* encrypt */
    if (!EVP_EncryptUpdate(cctx, dst, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;
    if (!EVP_EncryptFinal_ex(cctx, dst, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;

    /* append hmac */
    if (!EVP_MAC_update(hctx, buf->base + buf->off, dst - (buf->base + buf->off)) ||
        !EVP_MAC_final(hctx, dst, &hlen, EVP_MAC_CTX_get_mac_size(hctx))) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += hlen;

    assert(dst <= buf->base + buf->capacity);
    buf->off += dst - (buf->base + buf->off);
    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        EVP_MAC_CTX_free(hctx);
    if (mac != NULL)
        EVP_MAC_free(mac);
    return ret;
}